

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathNodeSetCreate(xmlNodePtr val)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  xmlNodePtr nsNode;
  xmlNsPtr ns;
  xmlNodeSetPtr ret;
  xmlNodePtr val_local;
  
  val_local = (xmlNodePtr)(*xmlMalloc)(0x10);
  if (val_local == (xmlNodePtr)0x0) {
    val_local = (xmlNodePtr)0x0;
  }
  else {
    memset(val_local,0,0x10);
    if (val != (xmlNodePtr)0x0) {
      ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
      *(xmlNodePtr **)&val_local->type = ppxVar2;
      if (*(xmlNodePtr **)&val_local->type == (xmlNodePtr *)0x0) {
        (*xmlFree)(val_local);
        val_local = (xmlNodePtr)0x0;
      }
      else {
        memset(*(xmlNodePtr **)&val_local->type,0,0x50);
        *(int *)((long)&val_local->_private + 4) = 10;
        if (val->type == XML_NAMESPACE_DECL) {
          pxVar3 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
          if (pxVar3 == (xmlNodePtr)0x0) {
            xmlXPathFreeNodeSet((xmlNodeSetPtr)val_local);
            val_local = (xmlNodePtr)0x0;
          }
          else {
            iVar1 = *(int *)&val_local->_private;
            *(int *)&val_local->_private = iVar1 + 1;
            (*(xmlNodePtr **)&val_local->type)[iVar1] = pxVar3;
          }
        }
        else {
          iVar1 = *(int *)&val_local->_private;
          *(int *)&val_local->_private = iVar1 + 1;
          (*(xmlNodePtr **)&val_local->type)[iVar1] = val;
        }
      }
    }
  }
  return (xmlNodeSetPtr)val_local;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeSetCreate(xmlNodePtr val) {
    xmlNodeSetPtr ret;

    ret = (xmlNodeSetPtr) xmlMalloc(sizeof(xmlNodeSet));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlNodeSet));
    if (val != NULL) {
        ret->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (ret->nodeTab == NULL) {
	    xmlFree(ret);
	    return(NULL);
	}
	memset(ret->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
        ret->nodeMax = XML_NODESET_DEFAULT;
	if (val->type == XML_NAMESPACE_DECL) {
	    xmlNsPtr ns = (xmlNsPtr) val;
            xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

            if (nsNode == NULL) {
                xmlXPathFreeNodeSet(ret);
                return(NULL);
            }
	    ret->nodeTab[ret->nodeNr++] = nsNode;
	} else
	    ret->nodeTab[ret->nodeNr++] = val;
    }
    return(ret);
}